

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void DockNodeTreeUpdateSplitterFindTouchingNode
               (ImGuiDockNode *node,ImGuiAxis axis,int side,
               ImVector<ImGuiDockNode_*> *touching_nodes)

{
  int *piVar1;
  int iVar2;
  ImGuiDockNode *node_00;
  ImGuiDockNode **ppIVar3;
  ImGuiDockNode **__dest;
  int iVar4;
  int iVar5;
  ImGuiDockNode *pIVar6;
  
  while( true ) {
    pIVar6 = node;
    node_00 = pIVar6->ChildNodes[0];
    if (node_00 == (ImGuiDockNode *)0x0) {
      iVar2 = touching_nodes->Capacity;
      if (touching_nodes->Size == iVar2) {
        iVar5 = touching_nodes->Size + 1;
        if (iVar2 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar2 / 2 + iVar2;
        }
        if (iVar5 < iVar4) {
          iVar5 = iVar4;
        }
        if (iVar2 < iVar5) {
          if (GImGui != (ImGuiContext_conflict1 *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          __dest = (ImGuiDockNode **)(*GImAllocatorAllocFunc)((long)iVar5 << 3,GImAllocatorUserData)
          ;
          if (touching_nodes->Data != (ImGuiDockNode **)0x0) {
            memcpy(__dest,touching_nodes->Data,(long)touching_nodes->Size << 3);
            ppIVar3 = touching_nodes->Data;
            if ((ppIVar3 != (ImGuiDockNode **)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
          }
          touching_nodes->Data = __dest;
          touching_nodes->Capacity = iVar5;
        }
      }
      touching_nodes->Data[touching_nodes->Size] = pIVar6;
      touching_nodes->Size = touching_nodes->Size + 1;
      return;
    }
    if (((node_00->field_0xbd & 2) != 0) &&
       (((side == 0 || (pIVar6->SplitAxis != axis)) ||
        ((pIVar6->ChildNodes[1]->field_0xbd & 2) == 0)))) {
      DockNodeTreeUpdateSplitterFindTouchingNode(node_00,axis,side,touching_nodes);
    }
    node = pIVar6->ChildNodes[1];
    if ((node->field_0xbd & 2) == 0) break;
    if (((side != 1) && (pIVar6->SplitAxis == axis)) &&
       ((pIVar6->ChildNodes[0]->field_0xbd & 2) != 0)) {
      return;
    }
  }
  return;
}

Assistant:

static void DockNodeTreeUpdateSplitterFindTouchingNode(ImGuiDockNode* node, ImGuiAxis axis, int side, ImVector<ImGuiDockNode*>* touching_nodes)
{
    if (node->IsLeafNode())
    {
        touching_nodes->push_back(node);
        return;
    }
    if (node->ChildNodes[0]->IsVisible)
        if (node->SplitAxis != axis || side == 0 || !node->ChildNodes[1]->IsVisible)
            DockNodeTreeUpdateSplitterFindTouchingNode(node->ChildNodes[0], axis, side, touching_nodes);
    if (node->ChildNodes[1]->IsVisible)
        if (node->SplitAxis != axis || side == 1 || !node->ChildNodes[0]->IsVisible)
            DockNodeTreeUpdateSplitterFindTouchingNode(node->ChildNodes[1], axis, side, touching_nodes);
}